

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AllocatedSizeAtCapacity
          (RepeatedPtrFieldBase *this)

{
  undefined1 extraout_AL;
  Rep *pRVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar2;
  ThreadSafeArena *in_RCX;
  ThreadSafeArena *extraout_RDX;
  uint uVar3;
  MessageLite *prototype;
  RepeatedPtrFieldBase *this_00;
  bool bVar4;
  LogMessageFatal aLStack_50 [16];
  RepeatedPtrFieldBase *pRStack_40;
  
  uVar3 = this->current_size_;
  if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
    prototype = (MessageLite *)(ulong)(this->tagged_rep_or_elem_ != (void *)0x0);
  }
  else {
    pRVar1 = rep(this);
    prototype = (MessageLite *)(ulong)(uint)pRVar1->allocated_size;
  }
  if ((int)prototype < (int)uVar3) {
    this_00 = (RepeatedPtrFieldBase *)(ulong)uVar3;
    AllocatedSizeAtCapacity();
  }
  else {
    if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
      this_00 = (RepeatedPtrFieldBase *)(ulong)(this->tagged_rep_or_elem_ != (void *)0x0);
    }
    else {
      pRVar1 = rep(this);
      this_00 = (RepeatedPtrFieldBase *)(ulong)(uint)pRVar1->allocated_size;
    }
    uVar3 = this->capacity_proxy_ + 1;
    prototype = (MessageLite *)(ulong)uVar3;
    if ((int)this_00 <= (int)uVar3) {
      if (((ulong)this->tagged_rep_or_elem_ & 1) == 0) {
        bVar4 = this->tagged_rep_or_elem_ != (void *)0x0;
      }
      else {
        pRVar1 = rep(this);
        bVar4 = this->capacity_proxy_ < pRVar1->allocated_size;
      }
      return bVar4;
    }
  }
  AllocatedSizeAtCapacity();
  pVVar2 = prototype;
  pRStack_40 = this;
  if (extraout_RDX == (ThreadSafeArena *)0x0 && in_RCX != (ThreadSafeArena *)0x0) {
    if (prototype == (MessageLite *)0x0) {
      pVVar2 = (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_>
                *)0x0;
    }
    else {
      ThreadSafeArena::AddCleanup
                (in_RCX,prototype,arena_delete_object<google::protobuf::MessageLite>);
    }
  }
  else if (in_RCX != extraout_RDX) {
    if (extraout_RDX == (ThreadSafeArena *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (aLStack_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
                 ,0x1fb,0x16,"value_arena != nullptr");
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_50);
    }
    pVVar2 = NewFromPrototypeHelper(prototype,(Arena *)in_RCX);
    GenericTypeHandler<google::protobuf::MessageLite>::Merge(prototype,pVVar2);
  }
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
            (this_00,pVVar2);
  return (bool)extraout_AL;
}

Assistant:

inline bool AllocatedSizeAtCapacity() const {
    // Harden invariant size() <= allocated_size() <= Capacity().
    ABSL_DCHECK_LE(size(), allocated_size());
    ABSL_DCHECK_LE(allocated_size(), Capacity());
    // This combines optimization mentioned in `SizeAtCapacity()` and simplifies
    // `allocated_size()` in sso case.
    return using_sso() ? (tagged_rep_or_elem_ != nullptr)
                       : rep()->allocated_size >= Capacity();
  }